

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JustInTime.hpp
# Opt level: O1

void __thiscall
JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1>::JustInTimeActor<unsigned_int>
          (JustInTimeActor<Amstrad::FDC,_Cycles,_1,_1> *this,uint *args)

{
  FDC *this_00;
  uint uVar1;
  Cycles clock_rate;
  
  (this->super_Observer)._vptr_Observer = (_func_int **)&PTR_set_component_prefers_clocking_005a77b0
  ;
  this_00 = &this->object_;
  clock_rate.super_WrappedInt<Cycles>.length_._4_4_ = 0;
  clock_rate.super_WrappedInt<Cycles>.length_._0_4_ = *args;
  Amstrad::FDC::FDC(this_00,clock_rate);
  (this->time_since_update_).super_WrappedInt<Cycles>.length_ = 0;
  (this->time_until_event_).super_WrappedInt<Cycles>.length_ = 0;
  (this->time_overrun_).super_WrappedInt<Cycles>.length_ = 0;
  this->is_flushed_ = true;
  this->did_flush_ = false;
  this->clocking_preference_ = JustInTime;
  (this->flush_concurrency_check_).super___atomic_flag_base._M_i = false;
  (this->object_).super_i8272.super_MFMController.super_Controller.super_Source.observer_ =
       &this->super_Observer;
  uVar1 = (**(this->object_).super_i8272.super_MFMController.super_Controller.super_Source.
             _vptr_Source)(this_00);
  (**(this->super_Observer)._vptr_Observer)(this,this_00,(ulong)uVar1);
  return;
}

Assistant:

JustInTimeActor(Args&&... args) : object_(std::forward<Args>(args)...) {
			if constexpr (std::is_base_of<ClockingHint::Source, T>::value) {
				object_.set_clocking_hint_observer(this);
			}
		}